

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric;
  int iVar2;
  
  ref_node = ref_grid->node;
  uVar1 = ref_node->max;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4fe,
           "ref_metric_interpolated_curvature","malloc metric of REF_DBL negative");
    uVar1 = 1;
  }
  else {
    metric = (REF_DBL *)malloc((ulong)uVar1 * 0x30);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x4fe,"ref_metric_interpolated_curvature","malloc metric of REF_DBL NULL");
      uVar1 = 2;
    }
    else {
      uVar1 = ref_metric_from_curvature(metric,ref_grid);
      if (uVar1 == 0) {
        iVar2 = 0x14;
        do {
          uVar1 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x501,"ref_metric_interpolated_curvature",(ulong)uVar1,"grad");
            return uVar1;
          }
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        uVar1 = ref_metric_to_node(metric,ref_node);
        if (uVar1 == 0) {
          free(metric);
          uVar1 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x503,"ref_metric_interpolated_curvature",(ulong)uVar1,"to node");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x4ff,"ref_metric_interpolated_curvature",(ulong)uVar1,"curve");
      }
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolated_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric;
  REF_INT gradation;

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0), "grad");
  }
  RSS(ref_metric_to_node(metric, ref_node), "to node");
  ref_free(metric);

  return REF_SUCCESS;
}